

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.h
# Opt level: O0

void __thiscall jaegertracing::agent::thrift::AgentProcessor::~AgentProcessor(AgentProcessor *this)

{
  AgentProcessor *this_local;
  
  ~AgentProcessor(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~AgentProcessor() {}